

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrimmedSurfaceClipping.h
# Opt level: O0

bool anurbs::TrimmedSurfaceClipping::is_rect(Path *a,Path *b)

{
  bool bVar1;
  bool bVar2;
  bool local_232;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_218;
  byte local_1f9;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_1f8;
  byte local_1d9;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_1d8;
  byte local_1b9;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_1b8;
  byte local_199;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_198;
  byte local_179;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_178;
  byte local_159;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_158;
  byte local_139;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_138;
  byte local_119;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_118;
  byte local_f9;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_f8;
  byte local_d9;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_d8;
  byte local_b9;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_b8;
  byte local_99;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_98;
  byte local_79;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_78;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_50;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_38;
  Path *local_20;
  Path *b_local;
  Path *a_local;
  
  local_20 = b;
  b_local = a;
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector(&local_38,a);
  local_79 = 0;
  local_99 = 0;
  local_b9 = 0;
  local_d9 = 0;
  local_f9 = 0;
  local_119 = 0;
  local_139 = 0;
  local_159 = 0;
  local_179 = 0;
  local_199 = 0;
  local_1b9 = 0;
  local_1d9 = 0;
  local_1f9 = 0;
  bVar1 = false;
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector(&local_50,b);
  bVar2 = is_rect(&local_38,&local_50,0,1,2,3);
  local_232 = true;
  if (!bVar2) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector(&local_78,a);
    local_79 = 1;
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector(&local_98,b);
    local_99 = 1;
    bVar2 = is_rect(&local_78,&local_98,1,2,3,0);
    local_232 = true;
    if (!bVar2) {
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector(&local_b8,a);
      local_b9 = 1;
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector(&local_d8,b);
      local_d9 = 1;
      bVar2 = is_rect(&local_b8,&local_d8,2,3,0,1);
      local_232 = true;
      if (!bVar2) {
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                  (&local_f8,a);
        local_f9 = 1;
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                  (&local_118,b);
        local_119 = 1;
        bVar2 = is_rect(&local_f8,&local_118,3,0,1,2);
        local_232 = true;
        if (!bVar2) {
          std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                    (&local_138,a);
          local_139 = 1;
          std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                    (&local_158,b);
          local_159 = 1;
          bVar2 = is_rect(&local_138,&local_158,3,2,1,0);
          local_232 = true;
          if (!bVar2) {
            std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                      (&local_178,a);
            local_179 = 1;
            std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                      (&local_198,b);
            local_199 = 1;
            bVar2 = is_rect(&local_178,&local_198,0,3,2,1);
            local_232 = true;
            if (!bVar2) {
              std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                        (&local_1b8,a);
              local_1b9 = 1;
              std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                        (&local_1d8,b);
              local_1d9 = 1;
              bVar2 = is_rect(&local_1b8,&local_1d8,1,0,3,2);
              local_232 = true;
              if (!bVar2) {
                std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                          (&local_1f8,a);
                local_1f9 = 1;
                std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                          (&local_218,b);
                bVar1 = true;
                local_232 = is_rect(&local_1f8,&local_218,2,1,0,3);
              }
            }
          }
        }
      }
    }
  }
  a_local._7_1_ = local_232;
  if (bVar1) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector(&local_218);
  }
  if ((local_1f9 & 1) != 0) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector(&local_1f8);
  }
  if ((local_1d9 & 1) != 0) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector(&local_1d8);
  }
  if ((local_1b9 & 1) != 0) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector(&local_1b8);
  }
  if ((local_199 & 1) != 0) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector(&local_198);
  }
  if ((local_179 & 1) != 0) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector(&local_178);
  }
  if ((local_159 & 1) != 0) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector(&local_158);
  }
  if ((local_139 & 1) != 0) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector(&local_138);
  }
  if ((local_119 & 1) != 0) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector(&local_118);
  }
  if ((local_f9 & 1) != 0) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector(&local_f8);
  }
  if ((local_d9 & 1) != 0) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector(&local_d8);
  }
  if ((local_b9 & 1) != 0) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector(&local_b8);
  }
  if ((local_99 & 1) != 0) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector(&local_98);
  }
  if ((local_79 & 1) != 0) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector(&local_78);
  }
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector(&local_50);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector(&local_38);
  return (bool)(a_local._7_1_ & 1);
}

Assistant:

static inline bool is_rect(ClipperLib::Path a, ClipperLib::Path b)
    {
        return is_rect(a, b, 0, 1, 2, 3) || is_rect(a, b, 1, 2, 3, 0) || is_rect(a, b, 2, 3, 0, 1) || is_rect(a, b, 3, 0, 1, 2) || is_rect(a, b, 3, 2, 1, 0) || is_rect(a, b, 0, 3, 2, 1) || is_rect(a, b, 1, 0, 3, 2) || is_rect(a, b, 2, 1, 0, 3);
    }